

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O2

void __thiscall cppgenerate::Constructor::Constructor(Constructor *this,Constructor *other)

{
  list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_> *this_00;
  
  (this->m_documentation)._M_dataplus._M_p = (pointer)&(this->m_documentation).field_2;
  (this->m_documentation)._M_string_length = 0;
  (this->m_documentation).field_2._M_local_buf[0] = '\0';
  this_00 = &this->m_arguments;
  (this->m_arguments).
  super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->m_arguments).
  super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->m_arguments).
  super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
  _M_size = 0;
  CodeBlock::CodeBlock(&this->m_code);
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::operator=
            (this_00,&other->m_arguments);
  CodeBlock::operator=(&this->m_code,&other->m_code);
  this->m_accessModifier = other->m_accessModifier;
  return;
}

Assistant:

Constructor::Constructor( const Constructor& other ){
    m_documentation = other.m_documentation;
    m_arguments = other.m_arguments;
    m_code = other.m_code;
    m_accessModifier = other.m_accessModifier;
}